

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_defs.hpp
# Opt level: O0

bool __thiscall
iutest::floating_point<float>::NanSensitiveAlmostEquals(floating_point<float> *this,_Myt *rhs)

{
  UInt UVar1;
  UInt UVar2;
  uint local_34;
  UInt kMaxUlps;
  UInt diff;
  UInt v2;
  UInt v1;
  _Myt *rhs_local;
  floating_point<float> *this_local;
  
  UVar1 = enable_bits(this);
  UVar1 = norm(UVar1);
  UVar2 = enable_bits(rhs);
  UVar2 = norm(UVar2);
  if (UVar2 < UVar1) {
    local_34 = UVar1 - UVar2;
  }
  else {
    local_34 = UVar2 - UVar1;
  }
  return local_34 < 5;
}

Assistant:

bool    NanSensitiveAlmostEquals(const _Myt& rhs) const
    {
        const UInt v1 = norm(enable_bits());
        const UInt v2 = norm(rhs.enable_bits());
        const UInt diff = (v1 > v2) ? v1 - v2 : v2 - v1;
        const UInt kMaxUlps = 4u;
        if( diff <= kMaxUlps )
        {
            return true;
        }
        return false;
    }